

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.cpp
# Opt level: O1

void __thiscall
GdlPass::DebugFsmTable(GdlPass *this,GrcManager *param_1,ostream *strmOut,bool fWorking)

{
  ulong uVar1;
  pointer ppFVar2;
  pointer ppFVar3;
  FsmState *pFVar4;
  bool bVar5;
  vector<FsmState_*,_std::allocator<FsmState_*>_> *pvVar6;
  ostream *poVar7;
  ulong uVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  char *pcVar13;
  vector<FsmState_*,_std::allocator<FsmState_*>_> *pvVar14;
  FsmState *this_00;
  
  if (this->m_pfsm == (FsmTable *)0x0) {
    pcVar13 = "No fsm\n";
    lVar9 = 7;
  }
  else {
    uVar1 = this->m_pfsm->m_cfsmc;
    pcVar13 = "\nFinal Table:            ";
    if (fWorking) {
      pcVar13 = "\nWorking Table:          ";
    }
    std::__ostream_insert<char,std::char_traits<char>>(strmOut,pcVar13,0x19);
    if (uVar1 != 0) {
      uVar11 = 0;
      do {
        OutputNumber(strmOut,(int)uVar11,6);
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (uVar11 < uVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\n                          ",0x1b);
    if (uVar1 != 0) {
      uVar11 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(strmOut,"- - - ",6);
        bVar5 = uVar11 < uVar1;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar5);
    }
    pvVar14 = &this->m_pfsm->m_vpfstate;
    pvVar6 = &this->m_pfsm->m_vpfstate;
    if (!fWorking) {
      pvVar14 = (vector<FsmState_*,_std::allocator<FsmState_*>_> *)&this->m_vifsFinalToWork;
      pvVar6 = (vector<FsmState_*,_std::allocator<FsmState_*>_> *)&this->m_vifsFinalToWork;
    }
    ppFVar2 = (pvVar6->super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    ppFVar3 = (pvVar14->super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppFVar2 != ppFVar3) {
      uVar11 = 0;
      do {
        if (fWorking) {
          this_00 = (this->m_pfsm->m_vpfstate).
                    super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)uVar11];
        }
        else {
          pFVar4 = (this->m_pfsm->m_vpfstate).
                   super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->m_vifsFinalToWork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar11]];
          this_00 = pFVar4->m_pfstateMerged;
          if (this_00 == (FsmState *)0x0) {
            this_00 = pFVar4;
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\n",1);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)strmOut);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,this_00->m_critSlotsMatched);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        if (this_00->m_pfstateMerged == (FsmState *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (strmOut,"                        ",0x18);
          iVar12 = extraout_EDX_00;
          if (uVar1 != 0) {
            uVar10 = 1;
            do {
              std::__ostream_insert<char,std::char_traits<char>>(strmOut," ",1);
              iVar12 = (this_00->m_vgiCells).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)(uVar10 - 1)];
              if (!fWorking) {
                pFVar4 = (this->m_pfsm->m_vpfstate).
                         super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar12]->m_pfstateMerged;
                if (pFVar4 != (FsmState *)0x0) {
                  iVar12 = pFVar4->m_ifsWorkIndex;
                }
                iVar12 = (this->m_vifsWorkToFinal).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar12];
              }
              OutputNumber(strmOut,iVar12,5);
              uVar8 = (ulong)uVar10;
              uVar10 = uVar10 + 1;
              iVar12 = extraout_EDX_01;
            } while (uVar8 < uVar1);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(strmOut,"  => state #",0xc);
          std::ostream::operator<<(strmOut,this_00->m_pfstateMerged->m_ifsWorkIndex);
          iVar12 = extraout_EDX;
        }
        FsmState::DebugFsmState(this_00,strmOut,iVar12);
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (uVar11 < (ulong)((long)ppFVar2 - (long)ppFVar3 >> (fWorking + 2U & 0x3f)));
    }
    std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\n                          ",0x1b);
    if (uVar1 != 0) {
      uVar11 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(strmOut,"- - - ",6);
        bVar5 = uVar11 < uVar1;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar5);
    }
    pcVar13 = "\n\n";
    lVar9 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(strmOut,pcVar13,lVar9);
  return;
}

Assistant:

void GdlPass::DebugFsmTable(GrcManager * /*pcman*/, std::ostream & strmOut, bool fWorking)
{
	if (m_pfsm == NULL)
	{
		strmOut << "No fsm\n";
		return;
	}

	auto const cfsmc = m_pfsm->NumberOfColumns();
	if (fWorking)
		strmOut << "\nWorking Table:          ";
	else
		strmOut << "\nFinal Table:            ";
	for (auto ifsmc = 0U; ifsmc < cfsmc; ++ifsmc)	// column headers
		OutputNumber(strmOut, ifsmc, 6);
	strmOut << "\n                          ";
	for (auto ifsmc = 0U; ifsmc < cfsmc; ++ifsmc)
		strmOut << "- - - ";


	auto ifsLim = (fWorking)? m_pfsm->RawNumberOfStates() : m_vifsFinalToWork.size();
	for (auto ifs = 0U; ifs < ifsLim; ++ifs)
	{
		FsmState * pfstate = (fWorking) ?
			m_pfsm->RawStateAt(ifs) :
			m_pfsm->StateAt(m_vifsFinalToWork[ifs]);

		strmOut << "\n" << ifs << ": " << pfstate->SlotsMatched() << "\n";

		if (pfstate->HasBeenMerged())
		{
			Assert(fWorking);
			strmOut << "  => state #" << pfstate->MergedState()->WorkIndex();
		}
		else
		{
			strmOut << "                        ";

			for (auto ifsmc = 0U; ifsmc < cfsmc; ++ifsmc)
			{
				strmOut << " ";
				int ifsmcValue = pfstate->CellValue(ifsmc);
				if (!fWorking)
				{
					if (m_pfsm->RawStateAt(ifsmcValue)->HasBeenMerged())
						ifsmcValue = m_pfsm->RawStateAt(ifsmcValue)->MergedState()->WorkIndex();
					ifsmcValue = m_vifsWorkToFinal[ifsmcValue];
				}
				OutputNumber(strmOut, ifsmcValue, 5);
			}
		}

		pfstate->DebugFsmState(strmOut, ifs);
	}

	strmOut << "\n                          ";
	for (auto ifsmc = 0U; ifsmc < cfsmc; ++ifsmc)
		strmOut << "- - - ";
	strmOut << "\n\n";
}